

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# show.hpp
# Opt level: O1

string * __thiscall
lambda::show<std::__cxx11::string>
          (string *__return_storage_ptr__,lambda *this,
          Maybe<std::__cxx11::basic_string<char>_> *maybe)

{
  lambda lVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40;
  undefined8 local_38;
  long local_30;
  undefined8 uStack_28;
  
  lVar1 = this[0x20];
  if (lVar1 == (lambda)0x1) {
    local_80 = (long *)&local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,*(long *)this,*(long *)(this + 8) + *(long *)this);
    local_40 = &local_30;
    if (local_80 == (long *)&local_70) {
      uStack_28 = uStack_68;
    }
    else {
      local_40 = local_80;
    }
    local_30 = CONCAT71(uStack_6f,local_70);
    local_38 = local_78;
    local_78 = 0;
    local_70 = 0;
    local_80 = (long *)&local_70;
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x15c99e);
    local_60 = &local_50;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_50 = *plVar4;
      lStack_48 = plVar3[3];
    }
    else {
      local_50 = *plVar4;
      local_60 = (long *)*plVar3;
    }
    local_58 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"None","");
  }
  if (lVar1 != (lambda)0x0) {
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_40 != &local_30) {
      operator_delete(local_40,local_30 + 1);
    }
    if (local_80 != (long *)&local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string show(const Maybe<T> maybe) {
    return maybe ? "Some(" + show(*maybe) + ")" : "None";
}